

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.hpp
# Opt level: O2

void __thiscall Diligent::DeviceContextGLImpl::BindInfo::Invalidate(BindInfo *this)

{
  BindInfo BStack_138;
  
  memset(&BStack_138,0,0x124);
  operator=(this,&BStack_138);
  std::array<Diligent::RefCntWeakPtr<Diligent::ShaderResourceBindingGLImpl>,_8UL>::~array
            (&BStack_138.super_CommittedShaderResources.SRBs);
  return;
}

Assistant:

void Invalidate()
        {
            *this = {};
        }